

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void Centaurus::DFARoutineEM64T<wchar_t>::emit_state
               (X86Assembler *as,Label *rejectlabel,DFAState<wchar_t> *state,int index,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,MyConstPool *pool)

{
  pointer pRVar1;
  NFATransition<wchar_t> *pNVar2;
  iterator __position;
  wchar_t wVar3;
  NFATransition<wchar_t> *tr;
  uint32_t instId;
  Range<wchar_t> *r;
  pointer pRVar4;
  wchar_t wVar5;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  transitions;
  Label looplabel;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  local_a0;
  Operand_ *local_88;
  anon_union_16_7_ed616b9d_for_Operand__0 local_80;
  Operand_ *local_70;
  Operand_ *local_68;
  Operand_ *local_60;
  anon_union_16_7_ed616b9d_for_Operand__0 local_58;
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  
  local_88 = (Operand_ *)rejectlabel;
  std::
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>::
  vector(&local_a0,&(state->super_NFABaseState<wchar_t,_Centaurus::IndexVector>).m_transitions);
  if (local_a0.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
    local_68 = (Operand_ *)(asmjit::x86OpData + 0x490);
    local_70 = (Operand_ *)(asmjit::x86OpData + 0x490);
    __position._M_current =
         local_a0.
         super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (((__position._M_current)->m_dest == index) && (state->m_long == true)) {
        local_48._packed[0] = (UInt64)0x210000149;
        local_48._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
        MyConstPool::load_charclass_filter<wchar_t>
                  (pool,(X86Xmm *)&local_48._any,&(__position._M_current)->m_label);
        (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_58,as);
        (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&local_58);
        local_80._packed[0] = (UInt64)0x32;
        local_80._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x191,(Operand_ *)(asmjit::x86OpData + 0x700),
                   (Operand_ *)&local_80._any);
        local_80._packed[0].i64 = (UInt64)0x3;
        local_80._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x15;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x1e1,(Operand_ *)(asmjit::x86OpData + 0x720),
                   (Operand_ *)(asmjit::x86OpData + 0x700),(Operand_ *)&local_80._any);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,7,local_60,local_68);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,local_70,0xf);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11a,(Operand_ *)&local_58._any);
        __position = std::
                     vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                     ::_M_erase(&local_a0,__position);
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
    } while (__position._M_current !=
             local_a0.
             super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (state->m_accept != false) {
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),
               (Operand_ *)(asmjit::x86OpData + 0x4e0));
  }
  if (local_a0.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58._packed[0] = (UInt64)1.65781168201985e-316;
    local_58._any.reserved12_4 = 6;
    local_58._any.reserved8_4 = 0;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
               (Operand_ *)&local_58._any);
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x490),
               (Operand_ *)(asmjit::x86OpData + 0x480));
    asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4e0),2);
    pNVar2 = local_a0.
             super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_a0.
              super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a0.
              super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x38) {
      pRVar4 = ((local_a0.
                 super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar1 = ((local_a0.
                 super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)pRVar1 - (long)pRVar4 & 0xffffffff0U) == 0x10) {
        if (pRVar1 == pRVar4) {
          wVar5 = L'\0';
          wVar3 = L'\0';
        }
        else {
          wVar5 = pRVar4->m_start;
          wVar3 = pRVar4->m_end;
        }
        if (wVar5 + L'\x01' == wVar3) {
          instId = 0x124;
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),wVar5);
        }
        else {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),wVar5);
          instId = 0x121;
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),wVar3 - wVar5);
        }
        asmjit::CodeEmitter::emit((CodeEmitter *)as,instId,local_88);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x11e,
                   (Operand_ *)
                   ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                    _M_impl.super__Vector_impl_data._M_start +
                   (local_a0.
                    super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_dest));
        goto LAB_0012d5f1;
      }
    }
    for (; pNVar2 != local_a0.
                     super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pNVar2 = pNVar2 + 1) {
      pRVar1 = (pNVar2->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pRVar4 = (pNVar2->m_label).m_ranges.
                    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1
          ) {
        wVar5 = pRVar4->m_start;
        if (wVar5 + L'\x01' == pRVar4->m_end) {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),wVar5);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x118,
                     (Operand_ *)
                     ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                      _M_impl.super__Vector_impl_data._M_start + pNVar2->m_dest));
        }
        else {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),wVar5);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                     pRVar4->m_end - pRVar4->m_start);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x115,
                     (Operand_ *)
                     ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                      _M_impl.super__Vector_impl_data._M_start + pNVar2->m_dest));
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
                     (Operand_ *)(asmjit::x86OpData + 0x490));
        }
      }
    }
  }
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,local_88);
LAB_0012d5f1:
  std::
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>::
  ~vector(&local_a0);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFAState<TCHAR>& state, int index, std::vector<asmjit::Label>& labels, MyConstPool& pool)
{
    std::vector<NFATransition<TCHAR> > transitions(state.get_transitions());

    for (auto i = transitions.begin(); i != transitions.end();)
    {
        if (i->dest() == index && state.is_long())
        {
            pool.load_charclass_filter(PATTERN2_REG, i->label());

            asmjit::Label looplabel = as.newLabel();

            as.bind(looplabel);

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(PATTERN2_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
            if (sizeof(TCHAR) == 2)
                as.sal(INDEX_REG, 1);
            as.add(INPUT_REG, INDEX_REG);
            as.cmp(INDEX_REG, 15);
            as.jg(looplabel);
            i = transitions.erase(i);
        }
        else
        {
            i++;
        }
    }

    if (state.is_accept_state())
        as.mov(BACKUP_REG, INPUT_REG);

    if (transitions.empty())
    {
        as.jmp(rejectlabel);
        return;
    }

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    if (transitions.size() == 1)
    {
        const NFATransition<TCHAR>& tr = transitions[0];

        if (tr.label().size() == 1)
        {
            const Range<TCHAR>& r = tr.label()[0];
            {
                if (r.start() + 1 == r.end())
                {
                    as.cmp(CHAR_REG, r.start());
                    as.jne(rejectlabel);
                }
                else
                {
                    as.sub(CHAR_REG, r.start());
                    as.cmp(CHAR_REG, r.end() - r.start());
                    as.jnb(rejectlabel);
                }
            }
            as.jmp(labels[tr.dest()]);

            return;
        }
    }
    for (const auto& tr : transitions)
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                //The range consists of one character: test for equality and jump
                as.cmp(CHAR_REG, r.start());
                as.je(labels[tr.dest()]);
            }
            else
            {
                //The range consists of multiple characters: range check and jump
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                as.jb(labels[tr.dest()]);
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    //Jump to the "reject trampoline" and check if the input has ever been accepted
    as.jmp(rejectlabel);
}